

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O0

float pbrt::NextFloatDown(float v)

{
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar1;
  float in_XMM0_Da;
  uint32_t ui;
  float local_4;
  
  eVar1 = IsInf<float>(0.0);
  if ((!eVar1) || (local_4 = in_XMM0_Da, 0.0 <= in_XMM0_Da)) {
    FloatToBits(0.0);
    local_4 = BitsToFloat(0);
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
inline float NextFloatDown(float v) {
    // Handle infinity and positive zero for _NextFloatDown()_
    if (IsInf(v) && v < 0.)
        return v;
    if (v == 0.f)
        v = -0.f;
    uint32_t ui = FloatToBits(v);
    if (v > 0)
        --ui;
    else
        ++ui;
    return BitsToFloat(ui);
}